

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaveinfo.c
# Opt level: O0

char * dtype2string(uint16 dtype)

{
  uint16 dtype_local;
  
  switch(dtype) {
  case 1:
    sprintf(hstr,"BOOLEAN");
    break;
  case 2:
    sprintf(hstr,"INTEGER8");
    break;
  case 3:
    sprintf(hstr,"INTEGER16");
    break;
  case 4:
    sprintf(hstr,"INTEGER32");
    break;
  case 5:
    sprintf(hstr,"UNSIGNED8");
    break;
  case 6:
    sprintf(hstr,"UNSIGNED16");
    break;
  case 7:
    sprintf(hstr,"UNSIGNED32");
    break;
  case 8:
    sprintf(hstr,"REAL32");
    break;
  case 9:
    sprintf(hstr,"VISIBLE_STRING");
    break;
  case 10:
    sprintf(hstr,"OCTET_STRING");
    break;
  default:
    sprintf(hstr,"Type 0x%4.4X",(ulong)dtype);
    break;
  case 0x10:
    sprintf(hstr,"INTEGER24");
    break;
  case 0x11:
    sprintf(hstr,"REAL64");
    break;
  case 0x15:
    sprintf(hstr,"INTEGER64");
    break;
  case 0x16:
    sprintf(hstr,"UNSIGNED24");
    break;
  case 0x1b:
    sprintf(hstr,"UNSIGNED64");
    break;
  case 0x30:
    sprintf(hstr,"BIT1");
    break;
  case 0x31:
    sprintf(hstr,"BIT2");
    break;
  case 0x32:
    sprintf(hstr,"BIT3");
    break;
  case 0x33:
    sprintf(hstr,"BIT4");
    break;
  case 0x34:
    sprintf(hstr,"BIT5");
    break;
  case 0x35:
    sprintf(hstr,"BIT6");
    break;
  case 0x36:
    sprintf(hstr,"BIT7");
    break;
  case 0x37:
    sprintf(hstr,"BIT8");
  }
  return hstr;
}

Assistant:

char* dtype2string(uint16 dtype)
{
    switch(dtype)
    {
        case ECT_BOOLEAN:
            sprintf(hstr, "BOOLEAN");
            break;
        case ECT_INTEGER8:
            sprintf(hstr, "INTEGER8");
            break;
        case ECT_INTEGER16:
            sprintf(hstr, "INTEGER16");
            break;
        case ECT_INTEGER32:
            sprintf(hstr, "INTEGER32");
            break;
        case ECT_INTEGER24:
            sprintf(hstr, "INTEGER24");
            break;
        case ECT_INTEGER64:
            sprintf(hstr, "INTEGER64");
            break;
        case ECT_UNSIGNED8:
            sprintf(hstr, "UNSIGNED8");
            break;
        case ECT_UNSIGNED16:
            sprintf(hstr, "UNSIGNED16");
            break;
        case ECT_UNSIGNED32:
            sprintf(hstr, "UNSIGNED32");
            break;
        case ECT_UNSIGNED24:
            sprintf(hstr, "UNSIGNED24");
            break;
        case ECT_UNSIGNED64:
            sprintf(hstr, "UNSIGNED64");
            break;
        case ECT_REAL32:
            sprintf(hstr, "REAL32");
            break;
        case ECT_REAL64:
            sprintf(hstr, "REAL64");
            break;
        case ECT_BIT1:
            sprintf(hstr, "BIT1");
            break;
        case ECT_BIT2:
            sprintf(hstr, "BIT2");
            break;
        case ECT_BIT3:
            sprintf(hstr, "BIT3");
            break;
        case ECT_BIT4:
            sprintf(hstr, "BIT4");
            break;
        case ECT_BIT5:
            sprintf(hstr, "BIT5");
            break;
        case ECT_BIT6:
            sprintf(hstr, "BIT6");
            break;
        case ECT_BIT7:
            sprintf(hstr, "BIT7");
            break;
        case ECT_BIT8:
            sprintf(hstr, "BIT8");
            break;
        case ECT_VISIBLE_STRING:
            sprintf(hstr, "VISIBLE_STRING");
            break;
        case ECT_OCTET_STRING:
            sprintf(hstr, "OCTET_STRING");
            break;
        default:
            sprintf(hstr, "Type 0x%4.4X", dtype);
    }
    return hstr;
}